

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O3

Machine * getStructure(Machine *__return_storage_ptr__,Machine *m,Register r,Functor *f)

{
  size_type *psVar1;
  pointer pcVar2;
  undefined1 auVar3 [12];
  Hix HVar4;
  Functor *pFVar5;
  bool bVar6;
  Mode MVar7;
  mapped_type *pmVar8;
  Hix *__k;
  int iVar9;
  Addr AVar10;
  Machine local_2a0;
  Machine local_230;
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  local_1c0;
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  local_190;
  undefined8 local_160;
  Mode local_158;
  undefined1 local_150 [8];
  Hcell hc;
  long local_110 [2];
  int local_100;
  Functor local_f8;
  Functor *local_d0;
  Machine *local_c8;
  undefined1 local_c0 [8];
  Hcell h;
  _Rb_tree_node_base local_88;
  size_t local_68;
  undefined8 local_60;
  Mode local_58;
  undefined8 local_50;
  key_type local_44;
  map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  *local_40;
  Hix local_34;
  
  std::
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  ::_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
              *)&local_2a0,
             (_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
              *)m);
  local_40 = &m->regval;
  std::
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  ::_Rb_tree(&local_2a0.regval._M_t,&local_40->_M_t);
  local_2a0.mode = m->mode;
  local_2a0.h.hix = (m->h).hix;
  local_2a0.s.hix = (m->s).hix;
  auVar3._4_4_ = 0xffffffd6;
  auVar3._0_4_ = r.r;
  auVar3._8_4_ = 0;
  AVar10 = deref(&local_2a0,(Addr)(auVar3 << 0x20));
  local_34 = AVar10.hix_.hix;
  local_50 = AVar10._0_8_;
  std::
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  ::~_Rb_tree(&local_2a0.regval._M_t);
  std::
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  ::~_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
               *)&local_2a0);
  std::
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  ::_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
              *)&local_230,
             (_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
              *)m);
  std::
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  ::_Rb_tree(&local_230.regval._M_t,&local_40->_M_t);
  __k = &m->h;
  local_230.mode = m->mode;
  local_230.h.hix = (m->h).hix;
  local_230.s.hix = (m->s).hix;
  AVar10.hix_.hix = local_34.hix;
  AVar10.tag_ = (undefined4)local_50;
  AVar10.r_.r = local_50._4_4_;
  machineAtAddr((Hcell *)local_150,&local_230,AVar10);
  std::
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  ::~_Rb_tree(&local_230.regval._M_t);
  std::
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  ::~_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
               *)&local_230);
  if (local_150._0_4_ == Ref) {
    local_c0._4_4_ = (m->h).hix + 1;
    psVar1 = &h.f_.id._M_string_length;
    h.f_.id._M_dataplus._M_p = (pointer)0x7;
    h.f_.id._M_string_length = 0x65676162726167;
    h.f_.id.field_2._8_4_ = 0xffffffd6;
    local_c0._0_4_ = Ref;
    local_d0 = f;
    local_c8 = __return_storage_ptr__;
    h._0_8_ = psVar1;
    pmVar8 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
             operator[](&m->heap,__k);
    pmVar8->tag = local_c0._0_4_;
    pmVar8->hix_ = (Hix)local_c0._4_4_;
    std::__cxx11::string::operator=((string *)&pmVar8->f_,(string *)&h);
    (pmVar8->f_).arity = h.f_.id.field_2._8_4_;
    if ((size_type *)h._0_8_ != psVar1) {
      operator_delete((void *)h._0_8_,h.f_.id._M_string_length + 1);
    }
    pFVar5 = local_d0;
    hc.f_._32_8_ = local_110;
    pcVar2 = (local_d0->id)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&hc.f_.arity,pcVar2,pcVar2 + (local_d0->id)._M_string_length);
    local_100 = pFVar5->arity;
    Hcell::functor((Hcell *)local_c0,(Functor *)&hc.f_.arity);
    local_44.hix = (m->h).hix + 1;
    pmVar8 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
             operator[](&m->heap,&local_44);
    pmVar8->tag = local_c0._0_4_;
    pmVar8->hix_ = (Hix)local_c0._4_4_;
    std::__cxx11::string::operator=((string *)&pmVar8->f_,(string *)&h);
    (pmVar8->f_).arity = h.f_.id.field_2._8_4_;
    if ((size_type *)h._0_8_ != psVar1) {
      operator_delete((void *)h._0_8_,h.f_.id._M_string_length + 1);
    }
    if ((long *)hc.f_._32_8_ != local_110) {
      operator_delete((void *)hc.f_._32_8_,local_110[0] + 1);
    }
    std::
    _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
    ::_Rb_tree(&local_1c0,
               (_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                *)m);
    std::
    _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
    ::_Rb_tree(&local_190,&local_40->_M_t);
    local_158 = m->mode;
    local_160._0_4_ = m->h;
    local_160._4_4_ = m->s;
    bind((int)local_c0,(sockaddr *)&local_1c0,(socklen_t)local_50);
    std::
    _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
    ::clear((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
             *)m);
    if (h.f_.id._M_dataplus._M_p != (pointer)0x0) {
      (m->heap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = h.tag;
      (m->heap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)h.f_.id._M_dataplus._M_p;
      (m->heap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)h.f_.id._M_string_length;
      (m->heap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)h.f_.id.field_2._M_allocated_capacity;
      *(_Rb_tree_header **)(h.f_.id._M_dataplus._M_p + 8) =
           &(m->heap)._M_t._M_impl.super__Rb_tree_header;
      (m->heap)._M_t._M_impl.super__Rb_tree_header._M_node_count = h.f_.id.field_2._8_8_;
      h.f_.id._M_dataplus._M_p = (pointer)0x0;
      h.f_.id.field_2._8_8_ = 0;
      h.f_.id._M_string_length = (size_type)&h;
      h.f_.id.field_2._M_allocated_capacity = (size_type)&h;
    }
    std::
    _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
    ::clear(&local_40->_M_t);
    if (local_88._M_parent != (_Base_ptr)0x0) {
      (m->regval)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = local_88._M_color;
      (m->regval)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = local_88._M_parent;
      (m->regval)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_88._M_left;
      (m->regval)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_88._M_right;
      (local_88._M_parent)->_M_parent = &(m->regval)._M_t._M_impl.super__Rb_tree_header._M_header;
      (m->regval)._M_t._M_impl.super__Rb_tree_header._M_node_count = local_68;
      local_88._M_parent = (_Base_ptr)0x0;
      local_68 = 0;
      local_88._M_left = &local_88;
      local_88._M_right = &local_88;
    }
    m->mode = local_58;
    m->h = (Hix)(undefined4)local_60;
    m->s = (Hix)local_60._4_4_;
    std::
    _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
    ::~_Rb_tree((_Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
                 *)&h.f_.arity);
    std::
    _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
    ::~_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                 *)local_c0);
    std::
    _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
    ::~_Rb_tree(&local_190);
    std::
    _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
    ::~_Rb_tree(&local_1c0);
    MVar7 = Write;
    iVar9 = 2;
    __return_storage_ptr__ = local_c8;
  }
  else {
    if (local_150._0_4_ != Str) {
      if (local_150._0_4_ == Functor) {
        __assert_fail("false && \"cannot call getStructure on a functor\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                      ,0x132,"Machine getStructure(Machine, Register, Functor)");
      }
      goto LAB_00103448;
    }
    local_44.hix = local_150._4_4_;
    pmVar8 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
             operator[](&m->heap,&local_44);
    local_f8.id._M_dataplus._M_p = (pointer)&local_f8.id.field_2;
    pcVar2 = (f->id)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,pcVar2,pcVar2 + (f->id)._M_string_length);
    local_f8.arity = f->arity;
    Hcell::functor((Hcell *)local_c0,&local_f8);
    bVar6 = Hcell::operator==(pmVar8,(Hcell *)local_c0);
    if ((size_type *)h._0_8_ != &h.f_.id._M_string_length) {
      operator_delete((void *)h._0_8_,h.f_.id._M_string_length + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.id._M_dataplus._M_p != &local_f8.id.field_2) {
      operator_delete(local_f8.id._M_dataplus._M_p,local_f8.id.field_2._M_allocated_capacity + 1);
    }
    if (!bVar6) goto LAB_00103448;
    __k = &m->s;
    MVar7 = Read;
    iVar9 = 1;
  }
  __k->hix = __k->hix + iVar9;
  m->mode = MVar7;
LAB_00103448:
  std::_Rb_tree_header::_Rb_tree_header
            (&(__return_storage_ptr__->heap)._M_t._M_impl.super__Rb_tree_header,
             &(m->heap)._M_t._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(__return_storage_ptr__->regval)._M_t._M_impl.super__Rb_tree_header,
             &(m->regval)._M_t._M_impl.super__Rb_tree_header);
  __return_storage_ptr__->mode = m->mode;
  HVar4.hix = (m->s).hix;
  __return_storage_ptr__->h = (Hix)(m->h).hix;
  __return_storage_ptr__->s = (Hix)HVar4.hix;
  if ((size_type *)hc._0_8_ != &hc.f_.id._M_string_length) {
    operator_delete((void *)hc._0_8_,hc.f_.id._M_string_length + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Machine getStructure(Machine m, Register r, Functor f) {
    const Addr addr = deref(m, r);
    const Hcell hc = machineAtAddr(m, addr);

    switch (hc.tag) {
        case Htag::Ref:
            m.heap[m.h] = Hcell::ref(m.h + 1);
            m.heap[m.h + 1] = Hcell::functor(f);
            m = bind(m, addr, m.h);
            m.h += 2;
            m.mode = Mode::Write;
            break;
        case Htag::Str:
            if (m.heap[hc.hix()] == Hcell::functor(f)) {
                m.s += 1;
                m.mode = Mode::Read;
            }
            break;
        case Htag::Functor:
            assert(false && "cannot call getStructure on a functor");
    }
    return m;
}